

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall NavierStokesBase::init_additional_state_types(NavierStokesBase *this)

{
  pointer pcVar1;
  ostringstream *poVar2;
  bool bVar3;
  int _Dsdt;
  int _Divu;
  int dummy_Dsdt_Type;
  int dummy_Divu_Type;
  int dummy_State_Type;
  char local_1ad;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined1 local_198 [24];
  undefined8 auStack_180 [46];
  
  additional_state_types_initialized = 1;
  pcVar1 = local_198 + 0x10;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"temp","");
  amrex::AmrLevel::isStateVariable((string *)local_198,&local_19c,&Temp);
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_1a8 = -1;
  have_divu = 0;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"divu","");
  bVar3 = amrex::AmrLevel::isStateVariable((string *)local_198,&local_1a0,&local_1a8);
  have_divu = (int)bVar3;
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  have_divu = (int)(local_1a0 == Divu_Type && have_divu != 0);
  if (verbose != 0) {
    local_198._8_8_ = amrex::OutStream();
    poVar2 = (ostringstream *)(local_198 + 0x10);
    local_198._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_198._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)((long)auStack_180 + *(long *)(local_198._16_8_ - 0x18)) =
         *(undefined8 *)(local_198._8_8_ + *(long *)(*(long *)local_198._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::init_additional_state_types()::have_divu = ",
               0x3d);
    std::ostream::operator<<(poVar2,have_divu);
    local_1ac = CONCAT31(local_1ac._1_3_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,(char *)&local_1ac,1);
    amrex::Print::~Print((Print *)local_198);
  }
  if ((have_divu != 0) && (local_1a8 != 0)) {
    local_198._8_8_ = amrex::OutStream();
    local_198._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_198._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 0x10));
    *(undefined8 *)((long)auStack_180 + *(long *)(local_198._16_8_ - 0x18)) =
         *(undefined8 *)(local_198._8_8_ + *(long *)(*(long *)local_198._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_198 + 0x10),"divu must be 0-th Divu_Type component in the state\n",
               0x33);
    amrex::Print::~Print((Print *)local_198);
    amrex::Abort_host("NavierStokesBase::init_additional_state_types()");
  }
  local_1ac = -1;
  have_dsdt = 0;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"dsdt","");
  bVar3 = amrex::AmrLevel::isStateVariable((string *)local_198,&local_1a4,&local_1ac);
  have_dsdt = (int)bVar3;
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  have_dsdt = (int)(local_1a4 == Dsdt_Type && have_dsdt != 0);
  if (verbose != 0) {
    local_198._8_8_ = amrex::OutStream();
    poVar2 = (ostringstream *)(local_198 + 0x10);
    local_198._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_198._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)((long)auStack_180 + *(long *)(local_198._16_8_ - 0x18)) =
         *(undefined8 *)(local_198._8_8_ + *(long *)(*(long *)local_198._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::init_additional_state_types()::have_dsdt = ",
               0x3d);
    std::ostream::operator<<(poVar2,have_dsdt);
    local_1ad = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,&local_1ad,1);
    amrex::Print::~Print((Print *)local_198);
  }
  if ((have_dsdt != 0) && (local_1ac != 0)) {
    local_198._8_8_ = amrex::OutStream();
    local_198._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_198._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 0x10));
    *(undefined8 *)((long)auStack_180 + *(long *)(local_198._16_8_ - 0x18)) =
         *(undefined8 *)(local_198._8_8_ + *(long *)(*(long *)local_198._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_198 + 0x10),"dsdt must be 0-th Dsdt_Type component in the state\n",
               0x33);
    amrex::Print::~Print((Print *)local_198);
    amrex::Abort_host("NavierStokesBase::init_additional_state_types()");
  }
  if ((have_dsdt != 0) && (have_divu == 0)) {
    local_198._8_8_ = amrex::OutStream();
    local_198._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_198._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 0x10));
    *(undefined8 *)((long)auStack_180 + *(long *)(local_198._16_8_ - 0x18)) =
         *(undefined8 *)(local_198._8_8_ + *(long *)(*(long *)local_198._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_198 + 0x10),"Must have divu in order to have dsdt\n",0x25);
    amrex::Print::~Print((Print *)local_198);
    amrex::Abort_host("NavierStokesBase::init_additional_state_types()");
  }
  num_state_type = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
  if ((verbose != 0) && (*(int *)(amrex::ParallelContext::frames + 0xc) == 0)) {
    local_198._8_8_ = amrex::OutStream();
    poVar2 = (ostringstream *)(local_198 + 0x10);
    local_198._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_198._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)((long)auStack_180 + *(long *)(local_198._16_8_ - 0x18)) =
         *(undefined8 *)(local_198._8_8_ + *(long *)(*(long *)local_198._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::init_additional_state_types: num_state_type = ",
               0x40);
    std::ostream::operator<<(poVar2,num_state_type);
    local_1ad = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,&local_1ad,1);
    amrex::Print::~Print((Print *)local_198);
  }
  return;
}

Assistant:

void
NavierStokesBase::init_additional_state_types ()
{
    additional_state_types_initialized = 1;
    //
    // Set "Temp" from user's variable setup.
    //
    int dummy_State_Type;
    int have_temp = isStateVariable("temp", dummy_State_Type, Temp);
    have_temp &= (dummy_State_Type == State_Type);
    AMREX_ASSERT((do_temp && have_temp)  ||  (!do_temp && !have_temp));

    int _Divu = -1;
    int dummy_Divu_Type;
    have_divu = 0;
    have_divu = isStateVariable("divu", dummy_Divu_Type, _Divu);
    have_divu = have_divu && dummy_Divu_Type == Divu_Type;
    if (verbose)
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types()::have_divu = "
                  << have_divu << '\n';
    }
    if (have_divu && _Divu!=Divu)
    {
        amrex::Print() << "divu must be 0-th Divu_Type component in the state\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }

    int _Dsdt = -1;
    int dummy_Dsdt_Type;
    have_dsdt = 0;
    have_dsdt = isStateVariable("dsdt", dummy_Dsdt_Type, _Dsdt);
    have_dsdt = have_dsdt && dummy_Dsdt_Type==Dsdt_Type;
    if (verbose)
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types()::have_dsdt = "
                       << have_dsdt << '\n';
    }
    if (have_dsdt && _Dsdt!=Dsdt)
    {
        amrex::Print() << "dsdt must be 0-th Dsdt_Type component in the state\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }
    if (have_dsdt && !have_divu)
    {
        amrex::Print() << "Must have divu in order to have dsdt\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }

    num_state_type = desc_lst.size();
    if (verbose && ParallelDescriptor::IOProcessor())
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types: num_state_type = "
                       << num_state_type << '\n';
    }
}